

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# standard_types.cc
# Opt level: O0

void addStandardTypes(Registry *r)

{
  Registry *pRVar1;
  string *this;
  Numeric *pNVar2;
  allocator local_1ba9;
  string local_1ba8 [38];
  undefined1 local_1b82;
  allocator local_1b81;
  string local_1b80 [39];
  allocator local_1b59;
  string local_1b58 [38];
  undefined1 local_1b32;
  allocator local_1b31;
  string local_1b30 [39];
  allocator local_1b09;
  string local_1b08 [38];
  undefined1 local_1ae2;
  allocator local_1ae1;
  string local_1ae0 [39];
  allocator local_1ab9;
  string local_1ab8 [39];
  allocator local_1a91;
  string local_1a90 [39];
  allocator local_1a69;
  string local_1a68 [39];
  allocator local_1a41;
  string local_1a40 [39];
  allocator local_1a19;
  string local_1a18 [39];
  allocator local_19f1;
  string local_19f0 [39];
  allocator local_19c9;
  string local_19c8 [39];
  allocator local_19a1;
  string local_19a0 [39];
  allocator local_1979;
  string local_1978 [39];
  allocator local_1951;
  string local_1950 [39];
  allocator local_1929;
  string local_1928 [39];
  allocator local_1901;
  string local_1900 [39];
  allocator local_18d9;
  string local_18d8 [39];
  allocator local_18b1;
  string local_18b0 [39];
  allocator local_1889;
  string local_1888 [39];
  allocator local_1861;
  string local_1860 [39];
  allocator local_1839;
  string local_1838 [39];
  allocator local_1811;
  string local_1810 [39];
  allocator local_17e9;
  string local_17e8 [39];
  allocator local_17c1;
  string local_17c0 [36];
  int local_179c;
  boost local_1798 [32];
  string local_1778 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1758 [39];
  allocator local_1731;
  string local_1730 [39];
  allocator local_1709;
  string local_1708 [39];
  allocator local_16e1;
  string local_16e0 [39];
  allocator local_16b9;
  string local_16b8 [39];
  allocator local_1691;
  string local_1690 [39];
  allocator local_1669;
  string local_1668 [39];
  allocator local_1641;
  string local_1640 [39];
  allocator local_1619;
  string local_1618 [39];
  allocator local_15f1;
  string local_15f0 [39];
  allocator local_15c9;
  string local_15c8 [39];
  allocator local_15a1;
  string local_15a0 [39];
  allocator local_1579;
  string local_1578 [39];
  allocator local_1551;
  string local_1550 [39];
  allocator local_1529;
  string local_1528 [39];
  allocator local_1501;
  string local_1500 [39];
  allocator local_14d9;
  string local_14d8 [39];
  allocator local_14b1;
  string local_14b0 [39];
  allocator local_1489;
  string local_1488 [39];
  allocator local_1461;
  string local_1460 [39];
  allocator local_1439;
  string local_1438 [39];
  allocator local_1411;
  string local_1410 [39];
  allocator local_13e9;
  string local_13e8 [39];
  allocator local_13c1;
  string local_13c0 [39];
  allocator local_1399;
  string local_1398 [39];
  allocator local_1371;
  string local_1370 [39];
  allocator local_1349;
  string local_1348 [39];
  allocator local_1321;
  string local_1320 [39];
  allocator local_12f9;
  string local_12f8 [36];
  int local_12d4;
  boost local_12d0 [32];
  string local_12b0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1290 [39];
  allocator local_1269;
  string local_1268 [39];
  allocator local_1241;
  string local_1240 [39];
  allocator local_1219;
  string local_1218 [39];
  allocator local_11f1;
  string local_11f0 [39];
  allocator local_11c9;
  string local_11c8 [39];
  allocator local_11a1;
  string local_11a0 [39];
  allocator local_1179;
  string local_1178 [39];
  allocator local_1151;
  string local_1150 [39];
  allocator local_1129;
  string local_1128 [39];
  allocator local_1101;
  string local_1100 [39];
  allocator local_10d9;
  string local_10d8 [39];
  allocator local_10b1;
  string local_10b0 [36];
  int local_108c;
  boost local_1088 [32];
  string local_1068 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1048 [39];
  allocator local_1021;
  string local_1020 [39];
  allocator local_ff9;
  string local_ff8 [39];
  allocator local_fd1;
  string local_fd0 [39];
  allocator local_fa9;
  string local_fa8 [39];
  allocator local_f81;
  string local_f80 [39];
  allocator local_f59;
  string local_f58 [39];
  allocator local_f31;
  string local_f30 [39];
  allocator local_f09;
  string local_f08 [39];
  allocator local_ee1;
  string local_ee0 [39];
  allocator local_eb9;
  string local_eb8 [39];
  allocator local_e91;
  string local_e90 [39];
  allocator local_e69;
  string local_e68 [39];
  allocator local_e41;
  string local_e40 [39];
  allocator local_e19;
  string local_e18 [39];
  allocator local_df1;
  string local_df0 [39];
  allocator local_dc9;
  string local_dc8 [39];
  allocator local_da1;
  string local_da0 [39];
  allocator local_d79;
  string local_d78 [36];
  int local_d54;
  boost local_d50 [32];
  string local_d30 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d10 [39];
  allocator local_ce9;
  string local_ce8 [39];
  allocator local_cc1;
  string local_cc0 [39];
  allocator local_c99;
  string local_c98 [39];
  allocator local_c71;
  string local_c70 [39];
  allocator local_c49;
  string local_c48 [39];
  allocator local_c21;
  string local_c20 [36];
  int local_bfc;
  boost local_bf8 [32];
  string local_bd8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_bb8 [39];
  allocator local_b91;
  string local_b90 [39];
  allocator local_b69;
  string local_b68 [39];
  allocator local_b41;
  string local_b40 [39];
  allocator local_b19;
  string local_b18 [39];
  allocator local_af1;
  string local_af0 [39];
  allocator local_ac9;
  string local_ac8 [39];
  allocator local_aa1;
  string local_aa0 [39];
  allocator local_a79;
  string local_a78 [36];
  int local_a54;
  boost local_a50 [32];
  string local_a30 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a10 [39];
  allocator local_9e9;
  string local_9e8 [39];
  allocator local_9c1;
  string local_9c0 [39];
  allocator local_999;
  string local_998 [39];
  allocator local_971;
  string local_970 [39];
  allocator local_949;
  string local_948 [39];
  allocator local_921;
  string local_920 [39];
  allocator local_8f9;
  string local_8f8 [39];
  allocator local_8d1;
  string local_8d0 [39];
  allocator local_8a9;
  string local_8a8 [39];
  allocator local_881;
  string local_880 [39];
  allocator local_859;
  string local_858 [39];
  allocator local_831;
  string local_830 [36];
  int local_80c;
  boost local_808 [32];
  string local_7e8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7c8 [39];
  allocator local_7a1;
  string local_7a0 [39];
  allocator local_779;
  string local_778 [39];
  allocator local_751;
  string local_750 [39];
  allocator local_729;
  string local_728 [39];
  allocator local_701;
  string local_700 [39];
  allocator local_6d9;
  string local_6d8 [39];
  allocator local_6b1;
  string local_6b0 [39];
  allocator local_689;
  string local_688 [39];
  allocator local_661;
  string local_660 [39];
  allocator local_639;
  string local_638 [39];
  allocator local_611;
  string local_610 [39];
  allocator local_5e9;
  string local_5e8 [39];
  allocator local_5c1;
  string local_5c0 [39];
  allocator local_599;
  string local_598 [39];
  allocator local_571;
  string local_570 [39];
  allocator local_549;
  string local_548 [39];
  allocator local_521;
  string local_520 [39];
  allocator local_4f9;
  string local_4f8 [36];
  int local_4d4;
  boost local_4d0 [32];
  string local_4b0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_490 [39];
  allocator local_469;
  string local_468 [39];
  allocator local_441;
  string local_440 [36];
  int local_41c;
  boost local_418 [32];
  string local_3f8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d8 [39];
  allocator local_3b1;
  string local_3b0 [39];
  allocator local_389;
  string local_388 [36];
  int local_364;
  boost local_360 [32];
  string local_340 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_320 [39];
  allocator local_2f9;
  string local_2f8 [39];
  allocator local_2d1;
  string local_2d0 [39];
  allocator local_2a9;
  string local_2a8 [39];
  allocator local_281;
  string local_280 [36];
  int local_25c;
  boost local_258 [32];
  string local_238 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218 [8];
  string normalized_type_name;
  allocator local_1f1;
  string local_1f0 [39];
  undefined1 local_1c9;
  string local_1c8 [39];
  allocator local_1a1;
  string local_1a0 [39];
  undefined1 local_179;
  string local_178 [36];
  int local_154;
  boost local_150 [32];
  string local_130 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110 [8];
  string suffix;
  ulong local_f0;
  size_t i;
  string local_e0 [39];
  allocator local_b9;
  string local_b8 [39];
  allocator local_91;
  string local_90 [39];
  allocator local_69;
  string local_68 [35];
  undefined1 local_45;
  allocator local_31;
  string local_30 [32];
  Registry *local_10;
  Registry *r_local;
  
  local_10 = r;
  this = (string *)operator_new(0x40);
  local_45 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"/nil",&local_31);
  Typelib::NullType::NullType((NullType *)this,(string *)local_30);
  local_45 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_68,"",&local_69);
  Typelib::Registry::add((Type *)r,this);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  pRVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_90,"/nil",&local_91);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b8,"/void",&local_b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e0,"",(allocator *)((long)&i + 7));
  Typelib::Registry::alias((string *)pRVar1,local_90,local_b8);
  std::__cxx11::string::~string(local_e0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&i + 7));
  std::__cxx11::string::~string(local_b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_b9);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  for (local_f0 = 0; local_f0 < 4; local_f0 = local_f0 + 1) {
    local_154 = addStandardTypes::sizes[local_f0] << 3;
    boost::lexical_cast<std::__cxx11::string,int>(local_150,&local_154);
    std::operator+((char *)local_130,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x119440);
    std::operator+(local_110,(char *)local_130);
    std::__cxx11::string::~string(local_130);
    std::__cxx11::string::~string((string *)local_150);
    pRVar1 = local_10;
    pNVar2 = (Numeric *)operator_new(0x48);
    local_179 = 1;
    std::operator+((char *)local_178,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"/");
    Typelib::Numeric::Numeric(pNVar2,local_178,(long)addStandardTypes::sizes[local_f0],SInt);
    local_179 = 0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1a0,"",&local_1a1);
    Typelib::Registry::add((Type *)pRVar1,(string *)pNVar2);
    std::__cxx11::string::~string(local_1a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_1a1);
    std::__cxx11::string::~string(local_178);
    pRVar1 = local_10;
    pNVar2 = (Numeric *)operator_new(0x48);
    local_1c9 = 1;
    std::operator+((char *)local_1c8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"/u");
    Typelib::Numeric::Numeric(pNVar2,local_1c8,(long)addStandardTypes::sizes[local_f0],UInt);
    local_1c9 = 0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1f0,"",&local_1f1);
    Typelib::Registry::add((Type *)pRVar1,(string *)pNVar2);
    std::__cxx11::string::~string(local_1f0);
    std::allocator<char>::~allocator((allocator<char> *)&local_1f1);
    std::__cxx11::string::~string(local_1c8);
    std::__cxx11::string::~string((string *)local_110);
  }
  local_25c = 8;
  boost::lexical_cast<std::__cxx11::string,int>(local_258,&local_25c);
  std::operator+((char *)local_238,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"/int");
  std::operator+(local_218,(char *)local_238);
  std::__cxx11::string::~string(local_238);
  std::__cxx11::string::~string((string *)local_258);
  pRVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_280,"/signed char",&local_281);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2a8,"",&local_2a9);
  Typelib::Registry::alias((string *)pRVar1,(string *)local_218,local_280);
  std::__cxx11::string::~string(local_2a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2a9);
  std::__cxx11::string::~string(local_280);
  std::allocator<char>::~allocator((allocator<char> *)&local_281);
  pRVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2d0,"/char",&local_2d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2f8,"",&local_2f9);
  Typelib::Registry::alias((string *)pRVar1,(string *)local_218,local_2d0);
  std::__cxx11::string::~string(local_2f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2f9);
  std::__cxx11::string::~string(local_2d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2d1);
  local_364 = 8;
  boost::lexical_cast<std::__cxx11::string,int>(local_360,&local_364);
  std::operator+((char *)local_340,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"/uint");
  std::operator+(local_320,(char *)local_340);
  std::__cxx11::string::operator=((string *)local_218,(string *)local_320);
  std::__cxx11::string::~string((string *)local_320);
  std::__cxx11::string::~string(local_340);
  std::__cxx11::string::~string((string *)local_360);
  pRVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_388,"/unsigned char",&local_389);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3b0,"",&local_3b1);
  Typelib::Registry::alias((string *)pRVar1,(string *)local_218,local_388);
  std::__cxx11::string::~string(local_3b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3b1);
  std::__cxx11::string::~string(local_388);
  std::allocator<char>::~allocator((allocator<char> *)&local_389);
  local_41c = 0x20;
  boost::lexical_cast<std::__cxx11::string,int>(local_418,&local_41c);
  std::operator+((char *)local_3f8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"/int");
  std::operator+(local_3d8,(char *)local_3f8);
  std::__cxx11::string::operator=((string *)local_218,(string *)local_3d8);
  std::__cxx11::string::~string((string *)local_3d8);
  std::__cxx11::string::~string(local_3f8);
  std::__cxx11::string::~string((string *)local_418);
  pRVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_440,"/wchar_t",&local_441);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_468,"",&local_469);
  Typelib::Registry::alias((string *)pRVar1,(string *)local_218,local_440);
  std::__cxx11::string::~string(local_468);
  std::allocator<char>::~allocator((allocator<char> *)&local_469);
  std::__cxx11::string::~string(local_440);
  std::allocator<char>::~allocator((allocator<char> *)&local_441);
  local_4d4 = 0x10;
  boost::lexical_cast<std::__cxx11::string,int>(local_4d0,&local_4d4);
  std::operator+((char *)local_4b0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"/int");
  std::operator+(local_490,(char *)local_4b0);
  std::__cxx11::string::operator=((string *)local_218,(string *)local_490);
  std::__cxx11::string::~string((string *)local_490);
  std::__cxx11::string::~string(local_4b0);
  std::__cxx11::string::~string((string *)local_4d0);
  pRVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_4f8,"/signed short int",&local_4f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_520,"",&local_521);
  Typelib::Registry::alias((string *)pRVar1,(string *)local_218,local_4f8);
  std::__cxx11::string::~string(local_520);
  std::allocator<char>::~allocator((allocator<char> *)&local_521);
  std::__cxx11::string::~string(local_4f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_4f9);
  pRVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_548,"/signed int short",&local_549);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_570,"",&local_571);
  Typelib::Registry::alias((string *)pRVar1,(string *)local_218,local_548);
  std::__cxx11::string::~string(local_570);
  std::allocator<char>::~allocator((allocator<char> *)&local_571);
  std::__cxx11::string::~string(local_548);
  std::allocator<char>::~allocator((allocator<char> *)&local_549);
  pRVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_598,"/int signed short",&local_599);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_5c0,"",&local_5c1);
  Typelib::Registry::alias((string *)pRVar1,(string *)local_218,local_598);
  std::__cxx11::string::~string(local_5c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_5c1);
  std::__cxx11::string::~string(local_598);
  std::allocator<char>::~allocator((allocator<char> *)&local_599);
  pRVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_5e8,"/short signed int",&local_5e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_610,"",&local_611);
  Typelib::Registry::alias((string *)pRVar1,(string *)local_218,local_5e8);
  std::__cxx11::string::~string(local_610);
  std::allocator<char>::~allocator((allocator<char> *)&local_611);
  std::__cxx11::string::~string(local_5e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_5e9);
  pRVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_638,"/signed short int",&local_639);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_660,"",&local_661);
  Typelib::Registry::alias((string *)pRVar1,(string *)local_218,local_638);
  std::__cxx11::string::~string(local_660);
  std::allocator<char>::~allocator((allocator<char> *)&local_661);
  std::__cxx11::string::~string(local_638);
  std::allocator<char>::~allocator((allocator<char> *)&local_639);
  pRVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_688,"/signed short",&local_689);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_6b0,"",&local_6b1);
  Typelib::Registry::alias((string *)pRVar1,(string *)local_218,local_688);
  std::__cxx11::string::~string(local_6b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_6b1);
  std::__cxx11::string::~string(local_688);
  std::allocator<char>::~allocator((allocator<char> *)&local_689);
  pRVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_6d8,"/short signed",&local_6d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_700,"",&local_701);
  Typelib::Registry::alias((string *)pRVar1,(string *)local_218,local_6d8);
  std::__cxx11::string::~string(local_700);
  std::allocator<char>::~allocator((allocator<char> *)&local_701);
  std::__cxx11::string::~string(local_6d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_6d9);
  pRVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_728,"/short",&local_729);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_750,"",&local_751);
  Typelib::Registry::alias((string *)pRVar1,(string *)local_218,local_728);
  std::__cxx11::string::~string(local_750);
  std::allocator<char>::~allocator((allocator<char> *)&local_751);
  std::__cxx11::string::~string(local_728);
  std::allocator<char>::~allocator((allocator<char> *)&local_729);
  pRVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_778,"/short int",&local_779);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_7a0,"",&local_7a1);
  Typelib::Registry::alias((string *)pRVar1,(string *)local_218,local_778);
  std::__cxx11::string::~string(local_7a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_7a1);
  std::__cxx11::string::~string(local_778);
  std::allocator<char>::~allocator((allocator<char> *)&local_779);
  local_80c = 0x10;
  boost::lexical_cast<std::__cxx11::string,int>(local_808,&local_80c);
  std::operator+((char *)local_7e8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"/uint");
  std::operator+(local_7c8,(char *)local_7e8);
  std::__cxx11::string::operator=((string *)local_218,(string *)local_7c8);
  std::__cxx11::string::~string((string *)local_7c8);
  std::__cxx11::string::~string(local_7e8);
  std::__cxx11::string::~string((string *)local_808);
  pRVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_830,"/short unsigned int",&local_831);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_858,"",&local_859);
  Typelib::Registry::alias((string *)pRVar1,(string *)local_218,local_830);
  std::__cxx11::string::~string(local_858);
  std::allocator<char>::~allocator((allocator<char> *)&local_859);
  std::__cxx11::string::~string(local_830);
  std::allocator<char>::~allocator((allocator<char> *)&local_831);
  pRVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_880,"/short int unsigned",&local_881);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_8a8,"",&local_8a9);
  Typelib::Registry::alias((string *)pRVar1,(string *)local_218,local_880);
  std::__cxx11::string::~string(local_8a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_8a9);
  std::__cxx11::string::~string(local_880);
  std::allocator<char>::~allocator((allocator<char> *)&local_881);
  pRVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_8d0,"/int short unsigned",&local_8d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_8f8,"",&local_8f9);
  Typelib::Registry::alias((string *)pRVar1,(string *)local_218,local_8d0);
  std::__cxx11::string::~string(local_8f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_8f9);
  std::__cxx11::string::~string(local_8d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_8d1);
  pRVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_920,"/unsigned short int",&local_921);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_948,"",&local_949);
  Typelib::Registry::alias((string *)pRVar1,(string *)local_218,local_920);
  std::__cxx11::string::~string(local_948);
  std::allocator<char>::~allocator((allocator<char> *)&local_949);
  std::__cxx11::string::~string(local_920);
  std::allocator<char>::~allocator((allocator<char> *)&local_921);
  pRVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_970,"/short unsigned",&local_971);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_998,"",&local_999);
  Typelib::Registry::alias((string *)pRVar1,(string *)local_218,local_970);
  std::__cxx11::string::~string(local_998);
  std::allocator<char>::~allocator((allocator<char> *)&local_999);
  std::__cxx11::string::~string(local_970);
  std::allocator<char>::~allocator((allocator<char> *)&local_971);
  pRVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_9c0,"/unsigned short",&local_9c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_9e8,"",&local_9e9);
  Typelib::Registry::alias((string *)pRVar1,(string *)local_218,local_9c0);
  std::__cxx11::string::~string(local_9e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_9e9);
  std::__cxx11::string::~string(local_9c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_9c1);
  local_a54 = 0x20;
  boost::lexical_cast<std::__cxx11::string,int>(local_a50,&local_a54);
  std::operator+((char *)local_a30,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"/int");
  std::operator+(local_a10,(char *)local_a30);
  std::__cxx11::string::operator=((string *)local_218,(string *)local_a10);
  std::__cxx11::string::~string((string *)local_a10);
  std::__cxx11::string::~string(local_a30);
  std::__cxx11::string::~string((string *)local_a50);
  pRVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a78,"/signed int",&local_a79);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_aa0,"",&local_aa1);
  Typelib::Registry::alias((string *)pRVar1,(string *)local_218,local_a78);
  std::__cxx11::string::~string(local_aa0);
  std::allocator<char>::~allocator((allocator<char> *)&local_aa1);
  std::__cxx11::string::~string(local_a78);
  std::allocator<char>::~allocator((allocator<char> *)&local_a79);
  pRVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_ac8,"/signed",&local_ac9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_af0,"",&local_af1);
  Typelib::Registry::alias((string *)pRVar1,(string *)local_218,local_ac8);
  std::__cxx11::string::~string(local_af0);
  std::allocator<char>::~allocator((allocator<char> *)&local_af1);
  std::__cxx11::string::~string(local_ac8);
  std::allocator<char>::~allocator((allocator<char> *)&local_ac9);
  pRVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b18,"/int signed",&local_b19);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b40,"",&local_b41);
  Typelib::Registry::alias((string *)pRVar1,(string *)local_218,local_b18);
  std::__cxx11::string::~string(local_b40);
  std::allocator<char>::~allocator((allocator<char> *)&local_b41);
  std::__cxx11::string::~string(local_b18);
  std::allocator<char>::~allocator((allocator<char> *)&local_b19);
  pRVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b68,"/int",&local_b69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b90,"",&local_b91);
  Typelib::Registry::alias((string *)pRVar1,(string *)local_218,local_b68);
  std::__cxx11::string::~string(local_b90);
  std::allocator<char>::~allocator((allocator<char> *)&local_b91);
  std::__cxx11::string::~string(local_b68);
  std::allocator<char>::~allocator((allocator<char> *)&local_b69);
  local_bfc = 0x20;
  boost::lexical_cast<std::__cxx11::string,int>(local_bf8,&local_bfc);
  std::operator+((char *)local_bd8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"/uint");
  std::operator+(local_bb8,(char *)local_bd8);
  std::__cxx11::string::operator=((string *)local_218,(string *)local_bb8);
  std::__cxx11::string::~string((string *)local_bb8);
  std::__cxx11::string::~string(local_bd8);
  std::__cxx11::string::~string((string *)local_bf8);
  pRVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c20,"/unsigned int",&local_c21);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c48,"",&local_c49);
  Typelib::Registry::alias((string *)pRVar1,(string *)local_218,local_c20);
  std::__cxx11::string::~string(local_c48);
  std::allocator<char>::~allocator((allocator<char> *)&local_c49);
  std::__cxx11::string::~string(local_c20);
  std::allocator<char>::~allocator((allocator<char> *)&local_c21);
  pRVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c70,"/unsigned",&local_c71);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c98,"",&local_c99);
  Typelib::Registry::alias((string *)pRVar1,(string *)local_218,local_c70);
  std::__cxx11::string::~string(local_c98);
  std::allocator<char>::~allocator((allocator<char> *)&local_c99);
  std::__cxx11::string::~string(local_c70);
  std::allocator<char>::~allocator((allocator<char> *)&local_c71);
  pRVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_cc0,"/int unsigned",&local_cc1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_ce8,"",&local_ce9);
  Typelib::Registry::alias((string *)pRVar1,(string *)local_218,local_cc0);
  std::__cxx11::string::~string(local_ce8);
  std::allocator<char>::~allocator((allocator<char> *)&local_ce9);
  std::__cxx11::string::~string(local_cc0);
  std::allocator<char>::~allocator((allocator<char> *)&local_cc1);
  local_d54 = 0x40;
  boost::lexical_cast<std::__cxx11::string,int>(local_d50,&local_d54);
  std::operator+((char *)local_d30,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"/int");
  std::operator+(local_d10,(char *)local_d30);
  std::__cxx11::string::operator=((string *)local_218,(string *)local_d10);
  std::__cxx11::string::~string((string *)local_d10);
  std::__cxx11::string::~string(local_d30);
  std::__cxx11::string::~string((string *)local_d50);
  pRVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d78,"/signed long int",&local_d79);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_da0,"",&local_da1);
  Typelib::Registry::alias((string *)pRVar1,(string *)local_218,local_d78);
  std::__cxx11::string::~string(local_da0);
  std::allocator<char>::~allocator((allocator<char> *)&local_da1);
  std::__cxx11::string::~string(local_d78);
  std::allocator<char>::~allocator((allocator<char> *)&local_d79);
  pRVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_dc8,"/signed int long",&local_dc9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_df0,"",&local_df1);
  Typelib::Registry::alias((string *)pRVar1,(string *)local_218,local_dc8);
  std::__cxx11::string::~string(local_df0);
  std::allocator<char>::~allocator((allocator<char> *)&local_df1);
  std::__cxx11::string::~string(local_dc8);
  std::allocator<char>::~allocator((allocator<char> *)&local_dc9);
  pRVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e18,"/int signed long",&local_e19);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e40,"",&local_e41);
  Typelib::Registry::alias((string *)pRVar1,(string *)local_218,local_e18);
  std::__cxx11::string::~string(local_e40);
  std::allocator<char>::~allocator((allocator<char> *)&local_e41);
  std::__cxx11::string::~string(local_e18);
  std::allocator<char>::~allocator((allocator<char> *)&local_e19);
  pRVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e68,"/long signed int",&local_e69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e90,"",&local_e91);
  Typelib::Registry::alias((string *)pRVar1,(string *)local_218,local_e68);
  std::__cxx11::string::~string(local_e90);
  std::allocator<char>::~allocator((allocator<char> *)&local_e91);
  std::__cxx11::string::~string(local_e68);
  std::allocator<char>::~allocator((allocator<char> *)&local_e69);
  pRVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_eb8,"/signed long int",&local_eb9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_ee0,"",&local_ee1);
  Typelib::Registry::alias((string *)pRVar1,(string *)local_218,local_eb8);
  std::__cxx11::string::~string(local_ee0);
  std::allocator<char>::~allocator((allocator<char> *)&local_ee1);
  std::__cxx11::string::~string(local_eb8);
  std::allocator<char>::~allocator((allocator<char> *)&local_eb9);
  pRVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f08,"/signed long",&local_f09);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f30,"",&local_f31);
  Typelib::Registry::alias((string *)pRVar1,(string *)local_218,local_f08);
  std::__cxx11::string::~string(local_f30);
  std::allocator<char>::~allocator((allocator<char> *)&local_f31);
  std::__cxx11::string::~string(local_f08);
  std::allocator<char>::~allocator((allocator<char> *)&local_f09);
  pRVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f58,"/long signed",&local_f59);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f80,"",&local_f81);
  Typelib::Registry::alias((string *)pRVar1,(string *)local_218,local_f58);
  std::__cxx11::string::~string(local_f80);
  std::allocator<char>::~allocator((allocator<char> *)&local_f81);
  std::__cxx11::string::~string(local_f58);
  std::allocator<char>::~allocator((allocator<char> *)&local_f59);
  pRVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_fa8,"/long",&local_fa9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_fd0,"",&local_fd1);
  Typelib::Registry::alias((string *)pRVar1,(string *)local_218,local_fa8);
  std::__cxx11::string::~string(local_fd0);
  std::allocator<char>::~allocator((allocator<char> *)&local_fd1);
  std::__cxx11::string::~string(local_fa8);
  std::allocator<char>::~allocator((allocator<char> *)&local_fa9);
  pRVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_ff8,"/long int",&local_ff9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1020,"",&local_1021);
  Typelib::Registry::alias((string *)pRVar1,(string *)local_218,local_ff8);
  std::__cxx11::string::~string(local_1020);
  std::allocator<char>::~allocator((allocator<char> *)&local_1021);
  std::__cxx11::string::~string(local_ff8);
  std::allocator<char>::~allocator((allocator<char> *)&local_ff9);
  local_108c = 0x40;
  boost::lexical_cast<std::__cxx11::string,int>(local_1088,&local_108c);
  std::operator+((char *)local_1068,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"/uint");
  std::operator+(local_1048,(char *)local_1068);
  std::__cxx11::string::operator=((string *)local_218,(string *)local_1048);
  std::__cxx11::string::~string((string *)local_1048);
  std::__cxx11::string::~string(local_1068);
  std::__cxx11::string::~string((string *)local_1088);
  pRVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_10b0,"/long unsigned int",&local_10b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_10d8,"",&local_10d9);
  Typelib::Registry::alias((string *)pRVar1,(string *)local_218,local_10b0);
  std::__cxx11::string::~string(local_10d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_10d9);
  std::__cxx11::string::~string(local_10b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_10b1);
  pRVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1100,"/long int unsigned",&local_1101);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1128,"",&local_1129);
  Typelib::Registry::alias((string *)pRVar1,(string *)local_218,local_1100);
  std::__cxx11::string::~string(local_1128);
  std::allocator<char>::~allocator((allocator<char> *)&local_1129);
  std::__cxx11::string::~string(local_1100);
  std::allocator<char>::~allocator((allocator<char> *)&local_1101);
  pRVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1150,"/int long unsigned",&local_1151);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1178,"",&local_1179);
  Typelib::Registry::alias((string *)pRVar1,(string *)local_218,local_1150);
  std::__cxx11::string::~string(local_1178);
  std::allocator<char>::~allocator((allocator<char> *)&local_1179);
  std::__cxx11::string::~string(local_1150);
  std::allocator<char>::~allocator((allocator<char> *)&local_1151);
  pRVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_11a0,"/unsigned long int",&local_11a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_11c8,"",&local_11c9);
  Typelib::Registry::alias((string *)pRVar1,(string *)local_218,local_11a0);
  std::__cxx11::string::~string(local_11c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_11c9);
  std::__cxx11::string::~string(local_11a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_11a1);
  pRVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_11f0,"/long unsigned",&local_11f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1218,"",&local_1219);
  Typelib::Registry::alias((string *)pRVar1,(string *)local_218,local_11f0);
  std::__cxx11::string::~string(local_1218);
  std::allocator<char>::~allocator((allocator<char> *)&local_1219);
  std::__cxx11::string::~string(local_11f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_11f1);
  pRVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1240,"/unsigned long",&local_1241);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1268,"",&local_1269);
  Typelib::Registry::alias((string *)pRVar1,(string *)local_218,local_1240);
  std::__cxx11::string::~string(local_1268);
  std::allocator<char>::~allocator((allocator<char> *)&local_1269);
  std::__cxx11::string::~string(local_1240);
  std::allocator<char>::~allocator((allocator<char> *)&local_1241);
  local_12d4 = 0x40;
  boost::lexical_cast<std::__cxx11::string,int>(local_12d0,&local_12d4);
  std::operator+((char *)local_12b0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"/int");
  std::operator+(local_1290,(char *)local_12b0);
  std::__cxx11::string::operator=((string *)local_218,(string *)local_1290);
  std::__cxx11::string::~string((string *)local_1290);
  std::__cxx11::string::~string(local_12b0);
  std::__cxx11::string::~string((string *)local_12d0);
  pRVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_12f8,"/signed long long int",&local_12f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1320,"",&local_1321);
  Typelib::Registry::alias((string *)pRVar1,(string *)local_218,local_12f8);
  std::__cxx11::string::~string(local_1320);
  std::allocator<char>::~allocator((allocator<char> *)&local_1321);
  std::__cxx11::string::~string(local_12f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_12f9);
  pRVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1348,"/signed long int long",&local_1349);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1370,"",&local_1371);
  Typelib::Registry::alias((string *)pRVar1,(string *)local_218,local_1348);
  std::__cxx11::string::~string(local_1370);
  std::allocator<char>::~allocator((allocator<char> *)&local_1371);
  std::__cxx11::string::~string(local_1348);
  std::allocator<char>::~allocator((allocator<char> *)&local_1349);
  pRVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1398,"/signed int long long",&local_1399);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_13c0,"",&local_13c1);
  Typelib::Registry::alias((string *)pRVar1,(string *)local_218,local_1398);
  std::__cxx11::string::~string(local_13c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_13c1);
  std::__cxx11::string::~string(local_1398);
  std::allocator<char>::~allocator((allocator<char> *)&local_1399);
  pRVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_13e8,"/int signed long long",&local_13e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1410,"",&local_1411);
  Typelib::Registry::alias((string *)pRVar1,(string *)local_218,local_13e8);
  std::__cxx11::string::~string(local_1410);
  std::allocator<char>::~allocator((allocator<char> *)&local_1411);
  std::__cxx11::string::~string(local_13e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_13e9);
  pRVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1438,"/long signed long int",&local_1439);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1460,"",&local_1461);
  Typelib::Registry::alias((string *)pRVar1,(string *)local_218,local_1438);
  std::__cxx11::string::~string(local_1460);
  std::allocator<char>::~allocator((allocator<char> *)&local_1461);
  std::__cxx11::string::~string(local_1438);
  std::allocator<char>::~allocator((allocator<char> *)&local_1439);
  pRVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1488,"/long long signed int",&local_1489);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_14b0,"",&local_14b1);
  Typelib::Registry::alias((string *)pRVar1,(string *)local_218,local_1488);
  std::__cxx11::string::~string(local_14b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_14b1);
  std::__cxx11::string::~string(local_1488);
  std::allocator<char>::~allocator((allocator<char> *)&local_1489);
  pRVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_14d8,"/long long int signed",&local_14d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1500,"",&local_1501);
  Typelib::Registry::alias((string *)pRVar1,(string *)local_218,local_14d8);
  std::__cxx11::string::~string(local_1500);
  std::allocator<char>::~allocator((allocator<char> *)&local_1501);
  std::__cxx11::string::~string(local_14d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_14d9);
  pRVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1528,"/signed long long",&local_1529);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1550,"",&local_1551);
  Typelib::Registry::alias((string *)pRVar1,(string *)local_218,local_1528);
  std::__cxx11::string::~string(local_1550);
  std::allocator<char>::~allocator((allocator<char> *)&local_1551);
  std::__cxx11::string::~string(local_1528);
  std::allocator<char>::~allocator((allocator<char> *)&local_1529);
  pRVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1578,"/long long signed",&local_1579);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_15a0,"",&local_15a1);
  Typelib::Registry::alias((string *)pRVar1,(string *)local_218,local_1578);
  std::__cxx11::string::~string(local_15a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_15a1);
  std::__cxx11::string::~string(local_1578);
  std::allocator<char>::~allocator((allocator<char> *)&local_1579);
  pRVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_15c8,"/long signed long",&local_15c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_15f0,"",&local_15f1);
  Typelib::Registry::alias((string *)pRVar1,(string *)local_218,local_15c8);
  std::__cxx11::string::~string(local_15f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_15f1);
  std::__cxx11::string::~string(local_15c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_15c9);
  pRVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1618,"/long long int",&local_1619);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1640,"",&local_1641);
  Typelib::Registry::alias((string *)pRVar1,(string *)local_218,local_1618);
  std::__cxx11::string::~string(local_1640);
  std::allocator<char>::~allocator((allocator<char> *)&local_1641);
  std::__cxx11::string::~string(local_1618);
  std::allocator<char>::~allocator((allocator<char> *)&local_1619);
  pRVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1668,"/long int long",&local_1669);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1690,"",&local_1691);
  Typelib::Registry::alias((string *)pRVar1,(string *)local_218,local_1668);
  std::__cxx11::string::~string(local_1690);
  std::allocator<char>::~allocator((allocator<char> *)&local_1691);
  std::__cxx11::string::~string(local_1668);
  std::allocator<char>::~allocator((allocator<char> *)&local_1669);
  pRVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_16b8,"/int long long",&local_16b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_16e0,"",&local_16e1);
  Typelib::Registry::alias((string *)pRVar1,(string *)local_218,local_16b8);
  std::__cxx11::string::~string(local_16e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_16e1);
  std::__cxx11::string::~string(local_16b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_16b9);
  pRVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1708,"/long long",&local_1709);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1730,"",&local_1731);
  Typelib::Registry::alias((string *)pRVar1,(string *)local_218,local_1708);
  std::__cxx11::string::~string(local_1730);
  std::allocator<char>::~allocator((allocator<char> *)&local_1731);
  std::__cxx11::string::~string(local_1708);
  std::allocator<char>::~allocator((allocator<char> *)&local_1709);
  local_179c = 0x40;
  boost::lexical_cast<std::__cxx11::string,int>(local_1798,&local_179c);
  std::operator+((char *)local_1778,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"/uint");
  std::operator+(local_1758,(char *)local_1778);
  std::__cxx11::string::operator=((string *)local_218,(string *)local_1758);
  std::__cxx11::string::~string((string *)local_1758);
  std::__cxx11::string::~string(local_1778);
  std::__cxx11::string::~string((string *)local_1798);
  pRVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_17c0,"/unsigned long long int",&local_17c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_17e8,"",&local_17e9);
  Typelib::Registry::alias((string *)pRVar1,(string *)local_218,local_17c0);
  std::__cxx11::string::~string(local_17e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_17e9);
  std::__cxx11::string::~string(local_17c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_17c1);
  pRVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1810,"/unsigned long int long",&local_1811);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1838,"",&local_1839);
  Typelib::Registry::alias((string *)pRVar1,(string *)local_218,local_1810);
  std::__cxx11::string::~string(local_1838);
  std::allocator<char>::~allocator((allocator<char> *)&local_1839);
  std::__cxx11::string::~string(local_1810);
  std::allocator<char>::~allocator((allocator<char> *)&local_1811);
  pRVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1860,"/unsigned int long long",&local_1861);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1888,"",&local_1889);
  Typelib::Registry::alias((string *)pRVar1,(string *)local_218,local_1860);
  std::__cxx11::string::~string(local_1888);
  std::allocator<char>::~allocator((allocator<char> *)&local_1889);
  std::__cxx11::string::~string(local_1860);
  std::allocator<char>::~allocator((allocator<char> *)&local_1861);
  pRVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_18b0,"/int unsigned long long",&local_18b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_18d8,"",&local_18d9);
  Typelib::Registry::alias((string *)pRVar1,(string *)local_218,local_18b0);
  std::__cxx11::string::~string(local_18d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_18d9);
  std::__cxx11::string::~string(local_18b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_18b1);
  pRVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1900,"/long unsigned long int",&local_1901);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1928,"",&local_1929);
  Typelib::Registry::alias((string *)pRVar1,(string *)local_218,local_1900);
  std::__cxx11::string::~string(local_1928);
  std::allocator<char>::~allocator((allocator<char> *)&local_1929);
  std::__cxx11::string::~string(local_1900);
  std::allocator<char>::~allocator((allocator<char> *)&local_1901);
  pRVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1950,"/long long unsigned int",&local_1951);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1978,"",&local_1979);
  Typelib::Registry::alias((string *)pRVar1,(string *)local_218,local_1950);
  std::__cxx11::string::~string(local_1978);
  std::allocator<char>::~allocator((allocator<char> *)&local_1979);
  std::__cxx11::string::~string(local_1950);
  std::allocator<char>::~allocator((allocator<char> *)&local_1951);
  pRVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_19a0,"/long long int unsigned",&local_19a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_19c8,"",&local_19c9);
  Typelib::Registry::alias((string *)pRVar1,(string *)local_218,local_19a0);
  std::__cxx11::string::~string(local_19c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_19c9);
  std::__cxx11::string::~string(local_19a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_19a1);
  pRVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_19f0,"/unsigned long long",&local_19f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1a18,"",&local_1a19);
  Typelib::Registry::alias((string *)pRVar1,(string *)local_218,local_19f0);
  std::__cxx11::string::~string(local_1a18);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a19);
  std::__cxx11::string::~string(local_19f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_19f1);
  pRVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1a40,"/long long unsigned",&local_1a41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1a68,"",&local_1a69);
  Typelib::Registry::alias((string *)pRVar1,(string *)local_218,local_1a40);
  std::__cxx11::string::~string(local_1a68);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a69);
  std::__cxx11::string::~string(local_1a40);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a41);
  pRVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1a90,"/long unsigned long",&local_1a91);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1ab8,"",&local_1ab9);
  Typelib::Registry::alias((string *)pRVar1,(string *)local_218,local_1a90);
  std::__cxx11::string::~string(local_1ab8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1ab9);
  std::__cxx11::string::~string(local_1a90);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a91);
  pRVar1 = local_10;
  pNVar2 = (Numeric *)operator_new(0x48);
  local_1ae2 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1ae0,"/float",&local_1ae1);
  Typelib::Numeric::Numeric(pNVar2,local_1ae0,4,Float);
  local_1ae2 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1b08,"",&local_1b09);
  Typelib::Registry::add((Type *)pRVar1,(string *)pNVar2);
  std::__cxx11::string::~string(local_1b08);
  std::allocator<char>::~allocator((allocator<char> *)&local_1b09);
  std::__cxx11::string::~string(local_1ae0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1ae1);
  pRVar1 = local_10;
  pNVar2 = (Numeric *)operator_new(0x48);
  local_1b32 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1b30,"/double",&local_1b31);
  Typelib::Numeric::Numeric(pNVar2,local_1b30,8,Float);
  local_1b32 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1b58,"",&local_1b59);
  Typelib::Registry::add((Type *)pRVar1,(string *)pNVar2);
  std::__cxx11::string::~string(local_1b58);
  std::allocator<char>::~allocator((allocator<char> *)&local_1b59);
  std::__cxx11::string::~string(local_1b30);
  std::allocator<char>::~allocator((allocator<char> *)&local_1b31);
  pRVar1 = local_10;
  pNVar2 = (Numeric *)operator_new(0x48);
  local_1b82 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1b80,"/bool",&local_1b81);
  Typelib::Numeric::Numeric(pNVar2,local_1b80,1,UInt);
  local_1b82 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1ba8,"",&local_1ba9);
  Typelib::Registry::add((Type *)pRVar1,(string *)pNVar2);
  std::__cxx11::string::~string(local_1ba8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1ba9);
  std::__cxx11::string::~string(local_1b80);
  std::allocator<char>::~allocator((allocator<char> *)&local_1b81);
  std::__cxx11::string::~string((string *)local_218);
  return;
}

Assistant:

static void addStandardTypes(Typelib::Registry& r)
{
    BOOST_STATIC_ASSERT((Typelib::NamespaceMark == '/'));

    r.add(new NullType("/nil"));
    r.alias("/nil", "/void");

    // Add standard sized integers
    static const int sizes[] = { 1, 2, 4, 8 };
    for (size_t i = 0; i < sizeof(sizes)/sizeof(sizes[0]); ++i)
    {
        std::string suffix = "int" + boost::lexical_cast<std::string>(sizes[i] * 8) + "_t";
        r.add(new Numeric("/"  + suffix, sizes[i], Numeric::SInt));
        r.add(new Numeric("/u" + suffix, sizes[i], Numeric::UInt));
    }

    std::string normalized_type_name = "/int" + boost::lexical_cast<std::string>(std::numeric_limits<signed char>::digits + 1) + "_t";
    r.alias(normalized_type_name, "/signed char");
    if (std::numeric_limits<char>::is_signed)
        r.alias(normalized_type_name, "/char");
    normalized_type_name = "/uint" + boost::lexical_cast<std::string>(std::numeric_limits<signed char>::digits + 1) + "_t";
    if (!std::numeric_limits<char>::is_signed)
        r.alias(normalized_type_name, "/char");
    r.alias(normalized_type_name, "/unsigned char");

    if(std::numeric_limits<wchar_t>::is_signed)
    {
        normalized_type_name = "/int" + boost::lexical_cast<std::string>(std::numeric_limits<wchar_t>::digits + 1) + "_t";
    } else {
        normalized_type_name = "/uint" + boost::lexical_cast<std::string>(std::numeric_limits<wchar_t>::digits) + "_t";
    }
    r.alias(normalized_type_name, "/wchar_t");

    normalized_type_name = "/int" + boost::lexical_cast<std::string>(std::numeric_limits<short int>::digits + 1) + "_t";
    r.alias(normalized_type_name, "/signed short int");
    r.alias(normalized_type_name, "/signed int short");
    r.alias(normalized_type_name, "/int signed short");
    r.alias(normalized_type_name, "/short signed int");
    r.alias(normalized_type_name, "/signed short int");
    r.alias(normalized_type_name, "/signed short");
    r.alias(normalized_type_name, "/short signed");
    r.alias(normalized_type_name, "/short");
    r.alias(normalized_type_name, "/short int");
    normalized_type_name = "/uint" + boost::lexical_cast<std::string>(std::numeric_limits<short int>::digits + 1) + "_t";
    r.alias(normalized_type_name, "/short unsigned int");
    r.alias(normalized_type_name, "/short int unsigned");
    r.alias(normalized_type_name, "/int short unsigned");
    r.alias(normalized_type_name, "/unsigned short int");
    r.alias(normalized_type_name, "/short unsigned");
    r.alias(normalized_type_name, "/unsigned short");

    normalized_type_name = "/int" + boost::lexical_cast<std::string>(std::numeric_limits<int>::digits + 1) + "_t";
    r.alias(normalized_type_name, "/signed int");
    r.alias(normalized_type_name, "/signed");
    r.alias(normalized_type_name, "/int signed");
    r.alias(normalized_type_name, "/int");
    normalized_type_name = "/uint" + boost::lexical_cast<std::string>(std::numeric_limits<int>::digits + 1) + "_t";
    r.alias(normalized_type_name, "/unsigned int");
    r.alias(normalized_type_name, "/unsigned");
    r.alias(normalized_type_name, "/int unsigned");

    normalized_type_name = "/int" + boost::lexical_cast<std::string>(std::numeric_limits<long>::digits + 1) + "_t";
    r.alias(normalized_type_name, "/signed long int");
    r.alias(normalized_type_name, "/signed int long");
    r.alias(normalized_type_name, "/int signed long");
    r.alias(normalized_type_name, "/long signed int");
    r.alias(normalized_type_name, "/signed long int");
    r.alias(normalized_type_name, "/signed long");
    r.alias(normalized_type_name, "/long signed");
    r.alias(normalized_type_name, "/long");
    r.alias(normalized_type_name, "/long int");
    normalized_type_name = "/uint" + boost::lexical_cast<std::string>(std::numeric_limits<long>::digits + 1) + "_t";
    r.alias(normalized_type_name, "/long unsigned int");
    r.alias(normalized_type_name, "/long int unsigned");
    r.alias(normalized_type_name, "/int long unsigned");
    r.alias(normalized_type_name, "/unsigned long int");
    r.alias(normalized_type_name, "/long unsigned");
    r.alias(normalized_type_name, "/unsigned long");

    normalized_type_name = "/int" + boost::lexical_cast<std::string>(std::numeric_limits<long long>::digits + 1) + "_t";
    r.alias(normalized_type_name, "/signed long long int");
    r.alias(normalized_type_name, "/signed long int long");
    r.alias(normalized_type_name, "/signed int long long");
    r.alias(normalized_type_name, "/int signed long long");
    r.alias(normalized_type_name, "/long signed long int");
    r.alias(normalized_type_name, "/long long signed int");
    r.alias(normalized_type_name, "/long long int signed");
    r.alias(normalized_type_name, "/signed long long");
    r.alias(normalized_type_name, "/long long signed");
    r.alias(normalized_type_name, "/long signed long");
    r.alias(normalized_type_name, "/long long int");
    r.alias(normalized_type_name, "/long int long");
    r.alias(normalized_type_name, "/int long long");
    r.alias(normalized_type_name, "/long long");
    normalized_type_name = "/uint" + boost::lexical_cast<std::string>(std::numeric_limits<long long>::digits + 1) + "_t";
    r.alias(normalized_type_name, "/unsigned long long int");
    r.alias(normalized_type_name, "/unsigned long int long");
    r.alias(normalized_type_name, "/unsigned int long long");
    r.alias(normalized_type_name, "/int unsigned long long");
    r.alias(normalized_type_name, "/long unsigned long int");
    r.alias(normalized_type_name, "/long long unsigned int");
    r.alias(normalized_type_name, "/long long int unsigned");
    r.alias(normalized_type_name, "/unsigned long long");
    r.alias(normalized_type_name, "/long long unsigned");
    r.alias(normalized_type_name, "/long unsigned long");

    BOOST_STATIC_ASSERT(( sizeof(float) == sizeof(int32_t) ));
    BOOST_STATIC_ASSERT(( sizeof(double) == sizeof(int64_t) ));
    r.add(new Numeric("/float",  4, Numeric::Float));
    r.add(new Numeric("/double", 8, Numeric::Float));

    // Finally, add definition for boolean types
    r.add(new Numeric("/bool", sizeof(bool), Numeric::UInt));
}